

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  bool bVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined8 uVar3;
  undefined7 uVar6;
  char *pcVar4;
  undefined7 extraout_var_02;
  ulong uVar5;
  undefined7 extraout_var_03;
  undefined4 in_register_0000003c;
  string *psVar7;
  byte local_192;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  text *part;
  reverse_iterator pos;
  string local_68 [7];
  bool any;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  fd_set *local_20;
  texts *include_local;
  text *name_local;
  
  psVar7 = (string *)CONCAT44(in_register_0000003c,__nfds);
  local_20 = __readfds;
  include_local = (texts *)psVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  bVar1 = none(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  if (bVar1) {
    std::__cxx11::string::string(local_68,psVar7);
    bVar1 = hidden((text *)local_68);
    name_local._7_1_ = (bVar1 ^ 0xffU) & 1;
    std::__cxx11::string::~string(local_68);
    uVar6 = extraout_var;
  }
  else {
    pos.current._M_current._7_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffff80);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&stack0xffffffffffffff88,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&stack0xffffffffffffff80);
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&part);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&stack0xffffffffffffff88,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&part);
      if (!bVar1) break;
      local_90 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)&stack0xffffffffffffff88);
      bVar1 = std::operator==(local_90,"@");
      uVar6 = extraout_var_00;
      if ((bVar1) || (bVar1 = std::operator==(local_90,"*"), uVar6 = extraout_var_01, bVar1)) {
        name_local._7_1_ = 1;
        goto LAB_001139fd;
      }
      std::__cxx11::string::string(local_b0,(string *)local_90);
      std::__cxx11::string::string(local_d0,psVar7);
      bVar1 = search((text *)local_b0,(text *)local_d0);
      std::__cxx11::string::~string(local_d0);
      uVar3 = std::__cxx11::string::~string(local_b0);
      uVar6 = (undefined7)((ulong)uVar3 >> 8);
      if (bVar1) {
        name_local._7_1_ = 1;
        goto LAB_001139fd;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      if (*pcVar4 == '!') {
        pos.current._M_current._7_1_ = 1;
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_90);
        std::__cxx11::string::string(local_f0,local_110);
        std::__cxx11::string::string(local_130,psVar7);
        bVar1 = search((text *)local_f0,(text *)local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_f0);
        uVar3 = std::__cxx11::string::~string(local_110);
        uVar6 = (undefined7)((ulong)uVar3 >> 8);
        if (bVar1) {
          name_local._7_1_ = 0;
          goto LAB_001139fd;
        }
      }
      else {
        pos.current._M_current._7_1_ = 0;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&stack0xffffffffffffff88);
    }
    uVar5 = 0;
    bVar1 = (pos.current._M_current._7_1_ & 1) != 0;
    local_192 = 0;
    if (bVar1) {
      std::__cxx11::string::string(local_150,psVar7);
      bVar2 = hidden((text *)local_150);
      uVar5 = CONCAT71(extraout_var_02,bVar2) ^ 0xff;
      local_192 = (byte)uVar5;
    }
    uVar6 = (undefined7)(uVar5 >> 8);
    name_local._7_1_ = local_192 & 1;
    if (bVar1) {
      std::__cxx11::string::~string(local_150);
      uVar6 = extraout_var_03;
    }
  }
LAB_001139fd:
  return (uint)CONCAT71(uVar6,name_local._7_1_) & 0xffffff01;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}